

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# web_peer_connection.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::web_peer_connection::write_request(web_peer_connection *this,peer_request *r)

{
  piece_index_t piece;
  torrent_info *this_00;
  _Elt_pointer ppVar1;
  io_context *ctx;
  span<const_char> buf;
  int64_t iVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  file_storage *pfVar6;
  iterator iVar7;
  size_type sVar8;
  uint uVar9;
  file_index_t index;
  _Rb_tree_header *p_Var10;
  ulong uVar11;
  int iVar12;
  uint uVar13;
  long n;
  uint uVar14;
  byte bVar15;
  key_type *__k;
  uint local_e8;
  peer_request pr;
  string request;
  file_request_t file_req_1;
  file_request_t file_req;
  shared_ptr<libtorrent::aux::torrent> t;
  undefined1 local_50 [32];
  
  ::std::__weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>::__weak_ptr
            ((__weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> *)&request,
             &(this->super_web_connection_base).super_peer_connection.
              super_peer_connection_hot_members.m_torrent.
              super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>);
  ::std::__shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>,&request);
  ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
            ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)&request._M_string_length);
  this_00 = ((t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            super_torrent_hot_members).m_torrent_file.
            super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  piece.m_val = (r->piece).m_val;
  iVar12 = r->start;
  local_e8 = r->length;
  request._M_dataplus._M_p = (pointer)&request.field_2;
  request._M_string_length = 0;
  request.field_2._M_local_buf[0] = '\0';
  ::std::__cxx11::string::reserve((ulong)&request);
  uVar5 = ((((t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            super_torrent_hot_members).m_torrent_file.
            super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          m_files).m_piece_length;
  uVar14 = 0x4000;
  if (uVar5 < 0x4000) {
    uVar14 = uVar5;
  }
  uVar13 = r->length;
  if ((int)uVar5 < 1) {
    uVar14 = 0x4000;
  }
  pr.length = 0;
  pr.piece.m_val = 0;
  pr.start = 0;
  for (; 0 < (int)uVar13; uVar13 = uVar13 - pr.length) {
    iVar4 = (r->start - uVar13) + r->length;
    pr.start = iVar4 % (int)uVar5;
    uVar9 = uVar5 - pr.start;
    pr.length = uVar14;
    if ((int)uVar13 < (int)uVar14) {
      pr.length = uVar13;
    }
    if ((int)uVar9 < pr.length) {
      pr.length = uVar9;
    }
    pr.piece.m_val = iVar4 / (int)uVar5 + (r->piece).m_val;
    ::std::deque<libtorrent::peer_request,_std::allocator<libtorrent::peer_request>_>::push_back
              (&(this->super_web_connection_base).m_requests,&pr);
    bVar3 = peer_request::operator==
                      (&this->m_web->restart_request,
                       (this->super_web_connection_base).m_requests.
                       super__Deque_base<libtorrent::peer_request,_std::allocator<libtorrent::peer_request>_>
                       ._M_impl.super__Deque_impl_data._M_start._M_cur);
    if (bVar3) {
      ::std::vector<char,_std::allocator<char>_>::_M_move_assign
                (&(this->m_piece).super_vector<char,_std::allocator<char>_>,
                 &this->m_web->restart_piece);
      ppVar1 = (this->super_web_connection_base).m_requests.
               super__Deque_base<libtorrent::peer_request,_std::allocator<libtorrent::peer_request>_>
               ._M_impl.super__Deque_impl_data._M_start._M_cur;
      peer_connection::peer_log
                ((peer_connection *)this,info,"RESTART_DATA","data: %d req: (%d, %d) size: %d",
                 (ulong)(uint)(*(int *)&(this->m_piece).super_vector<char,_std::allocator<char>_>.
                                        super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                        super__Vector_impl_data._M_finish -
                              *(int *)&(this->m_piece).super_vector<char,_std::allocator<char>_>.
                                       super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                       super__Vector_impl_data._M_start),
                 (ulong)(uint)(ppVar1->piece).m_val,(ulong)(uint)ppVar1->start,
                 (ulong)((ppVar1->start + ppVar1->length) - 1));
      iVar4 = *(int *)&(this->m_piece).super_vector<char,_std::allocator<char>_>.
                       super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_finish -
              *(int *)&(this->m_piece).super_vector<char,_std::allocator<char>_>.
                       super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start;
      peer_connection::incoming_piece_fragment((peer_connection *)this,iVar4);
      local_e8 = local_e8 - iVar4;
      iVar12 = iVar12 + iVar4;
      (this->m_web->restart_request).piece.m_val = -1;
    }
  }
  peer_connection::peer_log
            ((peer_connection *)this,outgoing_message,"REQUESTING",
             "(piece: %d start: %d) - (piece: %d end: %d)",(ulong)(uint)(r->piece).m_val,
             (ulong)(uint)r->start,pr._0_8_ & 0xffffffff,(ulong)(uint)(pr.length + pr.start));
  iVar4 = file_storage::num_files
                    (&(((t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr)->super_torrent_hot_members).m_torrent_file.
                       super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->m_files);
  uVar5 = session_settings::get_int
                    ((this->super_web_connection_base).super_peer_connection.
                     super_peer_connection_hot_members.m_settings,0x407b);
  bVar15 = ((this->super_web_connection_base).super_peer_connection.field_0x889 ^ 1) &
           (uVar5 & 0xfffffffe) == 4;
  if (iVar4 == 1) {
    n = (long)(this_00->m_files).m_piece_length * (long)piece.m_val + (long)iVar12;
    file_req._0_8_ = (ulong)local_e8 << 0x20;
    file_req.start = n;
    ::std::__cxx11::string::append((char *)&request);
    ::std::__cxx11::string::append((string *)&request);
    ::std::__cxx11::string::append((char *)&request);
    (*(this->super_web_connection_base).super_peer_connection.super_bandwidth_socket.
      _vptr_bandwidth_socket[0x36])
              (this,&request,
               (this->super_web_connection_base).super_peer_connection.
               super_peer_connection_hot_members.m_settings,(uint)bVar15);
    ::std::__cxx11::string::append((char *)&request);
    to_string((array<char,_22UL> *)local_50,n);
    ::std::__cxx11::string::append((char *)&request);
    ::std::__cxx11::string::append((char *)&request);
    to_string((array<char,_22UL> *)local_50,(long)(int)local_e8 + -1 + n);
    ::std::__cxx11::string::append((char *)&request);
    ::std::__cxx11::string::append((char *)&request);
    (this->super_web_connection_base).super_peer_connection.field_0x888 = 0;
    ::std::
    deque<libtorrent::aux::web_peer_connection::file_request_t,_std::allocator<libtorrent::aux::web_peer_connection::file_request_t>_>
    ::push_back(&this->m_file_requests,&file_req);
    iVar12 = 0;
  }
  else {
    pfVar6 = torrent_info::orig_files(this_00);
    file_storage::map_block
              ((vector<libtorrent::file_slice,_std::allocator<libtorrent::file_slice>_> *)&file_req,
               pfVar6,piece,(long)iVar12,(long)(int)local_e8);
    iVar2 = file_req.start;
    iVar12 = 0;
    for (__k = (key_type *)file_req._0_8_; __k != (key_type *)iVar2; __k = __k + 6) {
      file_req_1.file_index.m_val = __k->m_val;
      file_req_1.start = *(int64_t *)(__k + 2);
      file_req_1.length = __k[4].m_val;
      pfVar6 = torrent_info::orig_files(this_00);
      bVar3 = file_storage::pad_file_at(pfVar6,(file_index_t)__k->m_val);
      if (bVar3) {
        ::std::
        deque<libtorrent::aux::web_peer_connection::file_request_t,_std::allocator<libtorrent::aux::web_peer_connection::file_request_t>_>
        ::push_back(&this->m_file_requests,&file_req_1);
        iVar12 = iVar12 + 1;
      }
      else {
        ::std::__cxx11::string::append((char *)&request);
        if (bVar15 != 0) {
          ::std::__cxx11::string::append((string *)&request);
        }
        iVar7 = ::std::
                _Rb_tree<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>,_std::allocator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::find(&(this->m_web->redirects)._M_t,__k);
        p_Var10 = &(this->m_web->redirects)._M_t._M_impl.super__Rb_tree_header;
        if ((_Rb_tree_header *)iVar7._M_node == p_Var10) {
          if (bVar15 == 0) {
            ::std::__cxx11::string::append((string *)&request);
          }
          index.m_val = (int)p_Var10;
          pfVar6 = torrent_info::orig_files(this_00);
          escape_file_path_abi_cxx11_
                    ((string *)local_50,(aux *)pfVar6,(file_storage *)(ulong)(uint)__k->m_val,index)
          ;
          ::std::__cxx11::string::append((string *)&request);
          ::std::__cxx11::string::~string((string *)local_50);
        }
        else {
          if ((bVar15 == 0) || (iVar7._M_node[1]._M_left == (_Base_ptr)0x0)) {
            uVar11 = 0;
          }
          else {
            uVar11 = (ulong)((char)(iVar7._M_node[1]._M_parent)->_M_color == 0x2f);
          }
          ::std::__cxx11::string::append
                    ((string *)&request,(ulong)&iVar7._M_node[1]._M_parent,uVar11);
        }
        ::std::__cxx11::string::append((char *)&request);
        (*(this->super_web_connection_base).super_peer_connection.super_bandwidth_socket.
          _vptr_bandwidth_socket[0x36])
                  (this,&request,
                   (this->super_web_connection_base).super_peer_connection.
                   super_peer_connection_hot_members.m_settings,(uint)bVar15);
        ::std::__cxx11::string::append((char *)&request);
        to_string((array<char,_22UL> *)local_50,*(int64_t *)(__k + 2));
        ::std::__cxx11::string::append((char *)&request);
        ::std::__cxx11::string::append((char *)&request);
        to_string((array<char,_22UL> *)local_50,*(long *)(__k + 2) + *(long *)(__k + 4) + -1);
        ::std::__cxx11::string::append((char *)&request);
        ::std::__cxx11::string::append((char *)&request);
        (this->super_web_connection_base).super_peer_connection.field_0x888 = 0;
        ::std::
        deque<libtorrent::aux::web_peer_connection::file_request_t,_std::allocator<libtorrent::aux::web_peer_connection::file_request_t>_>
        ::push_back(&this->m_file_requests,&file_req_1);
      }
    }
    ::std::_Vector_base<libtorrent::file_slice,_std::allocator<libtorrent::file_slice>_>::
    ~_Vector_base((_Vector_base<libtorrent::file_slice,_std::allocator<libtorrent::file_slice>_> *)
                  &file_req);
  }
  sVar8 = ::std::
          deque<libtorrent::aux::web_peer_connection::file_request_t,_std::allocator<libtorrent::aux::web_peer_connection::file_request_t>_>
          ::size(&this->m_file_requests);
  if (iVar12 == (int)sVar8) {
    ctx = (this->super_web_connection_base).super_peer_connection.m_ios;
    ::std::__shared_ptr<libtorrent::aux::peer_connection,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<libtorrent::aux::peer_connection,void>
              ((__shared_ptr<libtorrent::aux::peer_connection,(__gnu_cxx::_Lock_policy)2> *)
               &file_req_1,
               (__weak_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2> *)
               &(this->super_web_connection_base).super_peer_connection.
                super_enable_shared_from_this<libtorrent::aux::peer_connection>);
    ::std::
    static_pointer_cast<libtorrent::aux::web_peer_connection,libtorrent::aux::peer_connection>
              ((shared_ptr<libtorrent::aux::peer_connection> *)&file_req);
    local_50._0_8_ = on_receive_padfile;
    local_50._8_8_ = 0;
    local_50._16_4_ = file_req.file_index.m_val;
    local_50._20_4_ = file_req.length;
    local_50._24_8_ = file_req.start;
    file_req.file_index.m_val = 0;
    file_req.length = 0;
    file_req.start = 0;
    boost::asio::
    post<boost::asio::io_context,std::_Bind<void(libtorrent::aux::web_peer_connection::*(std::shared_ptr<libtorrent::aux::web_peer_connection>))()>>
              (ctx,(_Bind<void_(libtorrent::aux::web_peer_connection::*(std::shared_ptr<libtorrent::aux::web_peer_connection>))()>
                    *)local_50,(type *)0x0);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_50 + 0x18));
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&file_req.start);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&file_req_1.start);
  }
  else {
    peer_connection::peer_log
              ((peer_connection *)this,outgoing_message,"REQUEST","%s",request._M_dataplus._M_p);
    buf.m_len = request._M_string_length;
    buf.m_ptr = request._M_dataplus._M_p;
    peer_connection::send_buffer((peer_connection *)this,buf);
  }
  ::std::__cxx11::string::~string((string *)&request);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  return;
}

Assistant:

void web_peer_connection::write_request(peer_request const& r)
{
	INVARIANT_CHECK;

	auto t = associated_torrent().lock();
	TORRENT_ASSERT(t);

	TORRENT_ASSERT(t->valid_metadata());

	torrent_info const& info = t->torrent_file();
	peer_request req = r;

	std::string request;
	request.reserve(400);

	int size = r.length;
	const int block_size = t->block_size();
	const int piece_size = t->torrent_file().piece_length();
	peer_request pr{};

	while (size > 0)
	{
		int request_offset = r.start + r.length - size;
		pr.start = request_offset % piece_size;
		pr.length = std::min(std::min(block_size, size), piece_size - pr.start);
		pr.piece = piece_index_t(static_cast<int>(r.piece) + request_offset / piece_size);
		TORRENT_ASSERT(validate_piece_request(pr));
		m_requests.push_back(pr);

		if (m_web->restart_request == m_requests.front())
		{
			TORRENT_ASSERT(int(m_piece.size()) == m_received_in_piece);
			TORRENT_ASSERT(m_piece.empty());
			m_piece = std::move(m_web->restart_piece);
			peer_request const& front = m_requests.front();
			TORRENT_ASSERT(front.length > int(m_piece.size()));

#ifndef TORRENT_DISABLE_LOGGING
			peer_log(peer_log_alert::info, "RESTART_DATA",
				"data: %d req: (%d, %d) size: %d"
					, int(m_piece.size()), static_cast<int>(front.piece), front.start
					, front.start + front.length - 1);
#else
			TORRENT_UNUSED(front);
#endif

			req.start += int(m_piece.size());
			req.length -= int(m_piece.size());

			// just to keep the accounting straight for the upper layer.
			// it doesn't know we just re-wrote the request
			incoming_piece_fragment(int(m_piece.size()));
			m_web->restart_request.piece = piece_index_t(-1);

			TORRENT_ASSERT(int(m_piece.size()) == m_received_in_piece);
		}

#if 0
			std::cerr << this << " REQ: p: " << pr.piece << " " << pr.start << std::endl;
#endif
		size -= pr.length;
	}

#ifndef TORRENT_DISABLE_LOGGING
	peer_log(peer_log_alert::outgoing_message, "REQUESTING", "(piece: %d start: %d) - (piece: %d end: %d)"
		, static_cast<int>(r.piece), r.start
		, static_cast<int>(pr.piece), pr.start + pr.length);
#endif

	bool const single_file_request = t->torrent_file().num_files() == 1;
	int const proxy_type = m_settings.get_int(settings_pack::proxy_type);
	bool const using_proxy = (proxy_type == settings_pack::http
		|| proxy_type == settings_pack::http_pw) && !m_ssl;

	// the number of pad files that have been "requested". In case we _only_
	// request padfiles, we can't rely on handling them in the on_receive()
	// callback (because we won't receive anything), instead we have to post a
	// pretend read callback where we can deliver the zeroes for the partfile
	int num_pad_files = 0;

	// TODO: 3 do we really need a special case here? wouldn't the multi-file
	// case handle single file torrents correctly too?
	if (single_file_request)
	{
		file_request_t file_req;
		file_req.file_index = file_index_t(0);
		file_req.start = std::int64_t(static_cast<int>(req.piece)) * info.piece_length()
			+ req.start;
		file_req.length = req.length;

		request += "GET ";
		// do not encode single file paths, they are
		// assumed to be encoded in the torrent file
		request += using_proxy ? m_url : m_path;
		request += " HTTP/1.1\r\n";
		add_headers(request, m_settings, using_proxy);
		request += "\r\nRange: bytes=";
		request += to_string(file_req.start).data();
		request += "-";
		request += to_string(file_req.start + file_req.length - 1).data();
		request += "\r\n\r\n";
		m_first_request = false;

		m_file_requests.push_back(file_req);
	}
	else
	{
		std::vector<file_slice> files = info.orig_files().map_block(req.piece, req.start
			, req.length);

		for (auto const &f : files)
		{
			file_request_t file_req;
			file_req.file_index = f.file_index;
			file_req.start = f.offset;
			file_req.length = int(f.size);

			if (info.orig_files().pad_file_at(f.file_index))
			{
				m_file_requests.push_back(file_req);
				++num_pad_files;
				continue;
			}

			request += "GET ";
			if (using_proxy)
			{
				// m_url is already a properly escaped URL
				// with the correct slashes. Don't encode it again
				request += m_url;
			}

			auto redirection = m_web->redirects.find(f.file_index);
			if (redirection != m_web->redirects.end())
			{
				auto const& redirect = redirection->second;
				// in case of http proxy "request" already contains m_url with trailing slash, so let's skip dup slash
				bool const trailing_slash = using_proxy && !redirect.empty() && redirect[0] == '/';
				request.append(redirect, trailing_slash, std::string::npos);
			}
			else
			{
				if (!using_proxy)
				{
					// m_path is already a properly escaped URL
					// with the correct slashes. Don't encode it again
					request += m_path;
				}

				request += escape_file_path(info.orig_files(), f.file_index);
			}
			request += " HTTP/1.1\r\n";
			add_headers(request, m_settings, using_proxy);
			request += "\r\nRange: bytes=";
			request += to_string(f.offset).data();
			request += "-";
			request += to_string(f.offset + f.size - 1).data();
			request += "\r\n\r\n";
			m_first_request = false;

#if 0
			std::cerr << this << " SEND-REQUEST: f: " << f.file_index
				<< " s: " << f.offset
				<< " e: " << (f.offset + f.size - 1) << std::endl;
#endif
			// TODO: 3 file_index_t should not allow negative values
			TORRENT_ASSERT(f.file_index >= file_index_t(0));

			m_file_requests.push_back(file_req);
		}
	}

	if (num_pad_files == int(m_file_requests.size()))
	{
		post(get_context(), std::bind(
			&web_peer_connection::on_receive_padfile,
			std::static_pointer_cast<web_peer_connection>(self())));
		return;
	}

#ifndef TORRENT_DISABLE_LOGGING
	peer_log(peer_log_alert::outgoing_message, "REQUEST", "%s", request.c_str());
#endif

	send_buffer(request);
}